

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O2

void poly1305_donna::poly1305_finish(poly1305_context *st,uchar *mac)

{
  uint32_t uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uchar uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = st->leftover;
  if (uVar4 != 0) {
    uVar5 = '\x01';
    do {
      st->buffer[uVar4] = uVar5;
      uVar4 = uVar4 + 1;
      uVar5 = '\0';
    } while (uVar4 < 0x10);
    st->final = '\x01';
    poly1305_blocks(st,st->buffer,0x10);
  }
  uVar3 = (st->h[1] >> 0x1a) + st->h[2];
  uVar6 = (uVar3 >> 0x1a) + st->h[3];
  uVar3 = uVar3 & 0x3ffffff;
  uVar7 = uVar6 & 0x3ffffff;
  uVar9 = (uVar6 >> 0x1a) + st->h[4];
  uVar12 = (uVar9 >> 0x1a) * 5 + st->h[0];
  uVar11 = (uVar12 >> 0x1a) + (st->h[1] & 0x3ffffff);
  uVar12 = uVar12 & 0x3ffffff;
  uVar6 = uVar12 + 5;
  uVar13 = (uVar6 >> 0x1a) + uVar11;
  uVar14 = (uVar13 >> 0x1a) + uVar3;
  uVar16 = (uVar14 >> 0x1a) + uVar7;
  uVar17 = uVar16 >> 0x1a;
  uVar10 = (int)(uVar17 + (uVar9 & 0x3ffffff) + -0x4000000) >> 0x1f;
  uVar8 = 0xffffffff - uVar10 & 0x3ffffff;
  uVar11 = uVar11 & uVar10 | uVar13 & uVar8;
  uVar3 = uVar3 & uVar10 | uVar14 & uVar8;
  uVar7 = uVar7 & uVar10 | uVar8 & uVar16;
  uVar6 = uVar11 << 0x1a | uVar12 & uVar10 | uVar6 & uVar8;
  uVar4 = (ulong)st->pad[1] + (ulong)(uVar3 << 0x14 | uVar11 >> 6) + (ulong)CARRY4(uVar6,st->pad[0])
  ;
  uVar1 = st->pad[3];
  lVar15 = (uVar4 >> 0x20) + (ulong)st->pad[2] + (ulong)(uVar7 << 0xe | uVar3 >> 0xc);
  WriteLE32(mac,uVar6 + st->pad[0]);
  WriteLE32(mac + 4,(uint32_t)uVar4);
  WriteLE32(mac + 8,(uint32_t)lVar15);
  WriteLE32(mac + 0xc,
            (int)((ulong)lVar15 >> 0x20) +
            ((uVar10 & uVar9 | 0xffffffff - uVar10 & uVar17 + (uVar9 & 0x3ffffff)) << 8 |
            uVar7 >> 0x12) + uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    st->h[3] = 0;
    st->h[4] = 0;
    st->pad[0] = 0;
    st->pad[1] = 0;
    *(undefined8 *)(st->r + 4) = 0;
    st->h[1] = 0;
    st->h[2] = 0;
    st->r[0] = 0;
    st->r[1] = 0;
    st->r[2] = 0;
    st->r[3] = 0;
    st->pad[2] = 0;
    st->pad[3] = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void poly1305_finish(poly1305_context *st, unsigned char mac[16]) noexcept {
    uint32_t h0,h1,h2,h3,h4,c;
    uint32_t g0,g1,g2,g3,g4;
    uint64_t f;
    uint32_t mask;

    /* process the remaining block */
    if (st->leftover) {
        size_t i = st->leftover;
        st->buffer[i++] = 1;
        for (; i < POLY1305_BLOCK_SIZE; i++) {
            st->buffer[i] = 0;
        }
        st->final = 1;
        poly1305_blocks(st, st->buffer, POLY1305_BLOCK_SIZE);
    }

    /* fully carry h */
    h0 = st->h[0];
    h1 = st->h[1];
    h2 = st->h[2];
    h3 = st->h[3];
    h4 = st->h[4];

                 c = h1 >> 26; h1 = h1 & 0x3ffffff;
    h2 +=     c; c = h2 >> 26; h2 = h2 & 0x3ffffff;
    h3 +=     c; c = h3 >> 26; h3 = h3 & 0x3ffffff;
    h4 +=     c; c = h4 >> 26; h4 = h4 & 0x3ffffff;
    h0 += c * 5; c = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     c;

    /* compute h + -p */
    g0 = h0 + 5; c = g0 >> 26; g0 &= 0x3ffffff;
    g1 = h1 + c; c = g1 >> 26; g1 &= 0x3ffffff;
    g2 = h2 + c; c = g2 >> 26; g2 &= 0x3ffffff;
    g3 = h3 + c; c = g3 >> 26; g3 &= 0x3ffffff;
    g4 = h4 + c - (1UL << 26);

    /* select h if h < p, or h + -p if h >= p */
    mask = (g4 >> ((sizeof(uint32_t) * 8) - 1)) - 1;
    g0 &= mask;
    g1 &= mask;
    g2 &= mask;
    g3 &= mask;
    g4 &= mask;
    mask = ~mask;
    h0 = (h0 & mask) | g0;
    h1 = (h1 & mask) | g1;
    h2 = (h2 & mask) | g2;
    h3 = (h3 & mask) | g3;
    h4 = (h4 & mask) | g4;

    /* h = h % (2^128) */
    h0 = ((h0      ) | (h1 << 26)) & 0xffffffff;
    h1 = ((h1 >>  6) | (h2 << 20)) & 0xffffffff;
    h2 = ((h2 >> 12) | (h3 << 14)) & 0xffffffff;
    h3 = ((h3 >> 18) | (h4 <<  8)) & 0xffffffff;

    /* mac = (h + pad) % (2^128) */
    f = (uint64_t)h0 + st->pad[0]            ; h0 = (uint32_t)f;
    f = (uint64_t)h1 + st->pad[1] + (f >> 32); h1 = (uint32_t)f;
    f = (uint64_t)h2 + st->pad[2] + (f >> 32); h2 = (uint32_t)f;
    f = (uint64_t)h3 + st->pad[3] + (f >> 32); h3 = (uint32_t)f;

    WriteLE32(mac +  0, h0);
    WriteLE32(mac +  4, h1);
    WriteLE32(mac +  8, h2);
    WriteLE32(mac + 12, h3);

    /* zero out the state */
    st->h[0] = 0;
    st->h[1] = 0;
    st->h[2] = 0;
    st->h[3] = 0;
    st->h[4] = 0;
    st->r[0] = 0;
    st->r[1] = 0;
    st->r[2] = 0;
    st->r[3] = 0;
    st->r[4] = 0;
    st->pad[0] = 0;
    st->pad[1] = 0;
    st->pad[2] = 0;
    st->pad[3] = 0;
}